

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  nk_draw_index nVar1;
  nk_draw_index nVar2;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  float *pfVar7;
  nk_vec2 *pnVar8;
  long lVar9;
  uint in_EDX;
  float *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  nk_vec2 nVar12;
  nk_vec2 nVar13;
  float len_1;
  nk_vec2 diff_1;
  nk_vec2 p2;
  nk_vec2 p1;
  nk_size i2_3;
  nk_vec2 uv_2;
  float dy;
  float dx;
  nk_draw_index *ids_1;
  void *vtx_1;
  nk_size vtx_count_1;
  nk_size idx_count_1;
  nk_size idx;
  nk_size i1_1;
  nk_vec2 uv_1;
  float scale_1;
  float dmr2_1;
  nk_vec2 dm_1;
  nk_size idx2_1;
  nk_size i2_2;
  nk_vec2 dm_in;
  nk_vec2 dm_out;
  nk_vec2 d2;
  nk_vec2 d1;
  float half_inner_thickness;
  nk_size i_1;
  nk_size idx1_1;
  nk_vec2 uv;
  float scale;
  nk_size idx2;
  nk_size i2_1;
  float dmr2;
  nk_vec2 dm;
  nk_vec2 d;
  nk_size i;
  nk_size idx1;
  float len;
  nk_vec2 diff;
  nk_size i2;
  nk_vec2 *temp;
  nk_vec2 *normals;
  nk_size size;
  nk_draw_index *ids;
  void *vtx;
  nk_size vtx_count;
  nk_size idx_count;
  nk_size index;
  nk_size vertex_offset;
  nk_size i1;
  float AA_SIZE;
  nk_colorf col_trans;
  nk_colorf col;
  int thick_line;
  nk_size count;
  float *in_stack_fffffffffffffb28;
  void *in_stack_fffffffffffffb30;
  nk_draw_list *in_stack_fffffffffffffb38;
  nk_convert_config *in_stack_fffffffffffffb48;
  void *in_stack_fffffffffffffb50;
  long in_stack_fffffffffffffb58;
  void *in_stack_fffffffffffffb60;
  nk_vec2 in_stack_fffffffffffffb68;
  nk_vec2 in_stack_fffffffffffffb70;
  nk_size in_stack_fffffffffffffb80;
  nk_vec2 *pnVar14;
  nk_size in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  nk_buffer_allocation_type type;
  nk_buffer *in_stack_fffffffffffffb98;
  float local_444;
  long local_430;
  float local_39c;
  long local_388;
  long local_330;
  float local_2ec;
  float local_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  nk_draw_index *local_2b8;
  void *local_2b0;
  ulong local_290;
  float fStack_23c;
  float local_238;
  nk_vec2 local_230;
  float local_218;
  float fStack_214;
  float local_210;
  float fStack_20c;
  float local_1b8;
  float fStack_1b4;
  float local_1b0;
  float fStack_1ac;
  ulong local_1a0;
  float fStack_15c;
  float local_158;
  nk_vec2 local_130;
  float fStack_10c;
  float local_108;
  float fStack_f4;
  float local_f0;
  float local_e0;
  float fStack_dc;
  ulong local_d8;
  float local_bc;
  float local_b8;
  float fStack_b4;
  nk_draw_index *local_90;
  ulong local_60;
  ulong local_30;
  
  type = (nk_buffer_allocation_type)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  if ((in_RDI != 0) && (1 < in_EDX)) {
    local_30 = (ulong)in_EDX;
    if (in_R8D == 0) {
      local_30 = (ulong)(in_EDX - 1);
    }
    nk_color_fv(in_stack_fffffffffffffb28,SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0));
    if (in_R9D == 1) {
      iVar5 = *(int *)(in_RDI + 0xcc);
      pvVar6 = nk_draw_list_alloc_vertices
                         (in_stack_fffffffffffffb38,(nk_size)in_stack_fffffffffffffb30);
      local_90 = nk_draw_list_alloc_elements
                           (in_stack_fffffffffffffb38,(nk_size)in_stack_fffffffffffffb30);
      if ((pvVar6 != (void *)0x0) && (local_90 != (nk_draw_index *)0x0)) {
        nk_buffer_mark(*(nk_buffer **)(in_RDI + 0xb8),NK_BUFFER_FRONT);
        pfVar7 = (float *)nk_buffer_alloc(in_stack_fffffffffffffb98,type,in_stack_fffffffffffffb88,
                                          in_stack_fffffffffffffb80);
        if (pfVar7 != (float *)0x0) {
          pnVar8 = (nk_vec2 *)(pfVar7 + (ulong)in_EDX * 2);
          for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
            if (local_60 + 1 == (ulong)in_EDX) {
              local_330 = 0;
            }
            else {
              local_330 = local_60 + 1;
            }
            nVar12 = nk_vec2(in_RSI[local_330 * 2] - in_RSI[local_60 * 2],
                             in_RSI[local_330 * 2 + 1] - in_RSI[local_60 * 2 + 1]);
            local_b8 = nVar12.x;
            fStack_b4 = nVar12.y;
            fVar10 = local_b8 * local_b8 + fStack_b4 * fStack_b4;
            if ((fVar10 != 0.0) || (NAN(fVar10))) {
              local_bc = nk_inv_sqrt((float)((ulong)in_stack_fffffffffffffb30 >> 0x20));
            }
            else {
              local_bc = 1.0;
            }
            nVar12 = nk_vec2(local_b8 * local_bc,fStack_b4 * local_bc);
            fStack_b4 = nVar12.y;
            pfVar7[local_60 * 2] = fStack_b4;
            local_b8 = nVar12.x;
            pfVar7[local_60 * 2 + 1] = -local_b8;
          }
          if (in_R8D == 0) {
            *(undefined8 *)(pfVar7 + (ulong)(in_EDX - 1) * 2) =
                 *(undefined8 *)(pfVar7 + (ulong)(in_EDX - 2) * 2);
          }
          if (1.0 < in_XMM0_Da) {
            fVar10 = (in_XMM0_Da - 1.0) * 0.5;
            if (in_R8D == 0) {
              nVar12 = nk_vec2(*pfVar7 * (fVar10 + 1.0),pfVar7[1] * (fVar10 + 1.0));
              nVar13 = nk_vec2(*pfVar7 * fVar10,pfVar7[1] * fVar10);
              local_1b0 = nVar12.x;
              fStack_1ac = nVar12.y;
              nVar12 = nk_vec2(*in_RSI + local_1b0,in_RSI[1] + fStack_1ac);
              *pnVar8 = nVar12;
              local_1b8 = nVar13.x;
              fStack_1b4 = nVar13.y;
              nVar12 = nk_vec2(*in_RSI + local_1b8,in_RSI[1] + fStack_1b4);
              pnVar8[1] = nVar12;
              nVar12 = nk_vec2(*in_RSI - local_1b8,in_RSI[1] - fStack_1b4);
              pnVar8[2] = nVar12;
              nVar12 = nk_vec2(*in_RSI - local_1b0,in_RSI[1] - fStack_1ac);
              pnVar8[3] = nVar12;
              nVar12 = nk_vec2(pfVar7[(ulong)(in_EDX - 1) * 2] * (fVar10 + 1.0),
                               pfVar7[(ulong)(in_EDX - 1) * 2 + 1] * (fVar10 + 1.0));
              nVar13 = nk_vec2(pfVar7[(ulong)(in_EDX - 1) * 2] * fVar10,
                               pfVar7[(ulong)(in_EDX - 1) * 2 + 1] * fVar10);
              local_1b0 = nVar12.x;
              fStack_1ac = nVar12.y;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] + local_1b0,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] + fStack_1ac);
              pnVar8[in_EDX * 4 - 4] = nVar12;
              local_1b8 = nVar13.x;
              fStack_1b4 = nVar13.y;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] + local_1b8,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] + fStack_1b4);
              pnVar8[(ulong)(in_EDX * 4 - 4) + 1] = nVar12;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] - local_1b8,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] - fStack_1b4);
              pnVar8[(ulong)(in_EDX * 4 - 4) + 2] = nVar12;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] - local_1b0,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] - fStack_1ac);
              pnVar8[in_EDX * 4 - 1] = nVar12;
            }
            iVar3 = iVar5;
            for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
              if (local_60 + 1 == (ulong)in_EDX) {
                local_430 = 0;
              }
              else {
                local_430 = local_60 + 1;
              }
              iVar4 = iVar5;
              if (local_60 + 1 != (ulong)in_EDX) {
                iVar4 = iVar3 + 4;
              }
              nVar12 = nk_vec2(pfVar7[local_60 * 2] + pfVar7[local_430 * 2],
                               pfVar7[local_60 * 2 + 1] + pfVar7[local_430 * 2 + 1]);
              local_238 = nVar12.x;
              nVar12 = nk_vec2(pfVar7[local_60 * 2] + pfVar7[local_430 * 2],
                               pfVar7[local_60 * 2 + 1] + pfVar7[local_430 * 2 + 1]);
              fStack_23c = nVar12.y;
              local_230 = nk_vec2(local_238 * 0.5,fStack_23c * 0.5);
              local_444 = local_230.x * local_230.x + local_230.y * local_230.y;
              if (1e-06 < local_444) {
                local_444 = 1.0 / local_444;
                if (100.0 < local_444) {
                  local_444 = 100.0;
                }
                local_230 = nk_vec2(local_230.x * local_444,local_230.y * local_444);
              }
              nVar12 = nk_vec2(local_230.x * (fVar10 + 1.0),local_230.y * (fVar10 + 1.0));
              nVar13 = nk_vec2(local_230.x * fVar10,local_230.y * fVar10);
              local_210 = nVar12.x;
              fStack_20c = nVar12.y;
              pnVar14 = pnVar8;
              nVar12 = nk_vec2(in_RSI[local_430 * 2] + local_210,
                               in_RSI[local_430 * 2 + 1] + fStack_20c);
              pnVar14[local_430 * 4] = nVar12;
              lVar9 = local_430 << 5;
              local_218 = nVar13.x;
              fStack_214 = nVar13.y;
              pnVar14 = pnVar8;
              nVar12 = nk_vec2(in_RSI[local_430 * 2] + local_218,
                               in_RSI[local_430 * 2 + 1] + fStack_214);
              *(nk_vec2 *)((long)&pnVar14[1].x + lVar9) = nVar12;
              lVar9 = local_430 << 5;
              nVar12 = nk_vec2(in_RSI[local_430 * 2] - local_218,
                               in_RSI[local_430 * 2 + 1] - fStack_214);
              *(nk_vec2 *)((long)&pnVar8[2].x + lVar9) = nVar12;
              nVar12 = nk_vec2(in_RSI[local_430 * 2] - local_210,
                               in_RSI[local_430 * 2 + 1] - fStack_20c);
              pnVar8[local_430 * 4 + 3] = nVar12;
              nVar1 = (nk_draw_index)iVar4;
              *local_90 = nVar1 + 1;
              nVar2 = (nk_draw_index)iVar3;
              local_90[1] = nVar2 + 1;
              local_90[2] = nVar2 + 2;
              local_90[3] = nVar2 + 2;
              local_90[4] = nVar1 + 2;
              local_90[5] = nVar1 + 1;
              local_90[6] = nVar1 + 1;
              local_90[7] = nVar2 + 1;
              local_90[8] = nVar2;
              local_90[9] = nVar2;
              local_90[10] = nVar1;
              local_90[0xb] = nVar1 + 1;
              local_90[0xc] = nVar1 + 2;
              local_90[0xd] = nVar2 + 2;
              local_90[0xe] = nVar2 + 3;
              local_90[0xf] = nVar2 + 3;
              local_90[0x10] = nVar1 + 3;
              local_90[0x11] = nVar1 + 2;
              local_90 = local_90 + 0x12;
              iVar3 = iVar4;
            }
            for (local_1a0 = 0; local_1a0 < in_EDX; local_1a0 = local_1a0 + 1) {
              color_03._8_8_ = in_stack_fffffffffffffb60;
              color_03.r = (float)(int)in_stack_fffffffffffffb58;
              color_03.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_03);
              color_04._8_8_ = in_stack_fffffffffffffb60;
              color_04.r = (float)(int)in_stack_fffffffffffffb58;
              color_04.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_04);
              color_05._8_8_ = in_stack_fffffffffffffb60;
              color_05.r = (float)(int)in_stack_fffffffffffffb58;
              color_05.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_05);
              color_06._8_8_ = in_stack_fffffffffffffb60;
              color_06.r = (float)(int)in_stack_fffffffffffffb58;
              color_06.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_06);
            }
          }
          else {
            if (in_R8D == 0) {
              fVar10 = *in_RSI;
              nVar12 = nk_vec2(*pfVar7,pfVar7[1]);
              local_f0 = nVar12.x;
              fVar11 = in_RSI[1];
              nVar12 = nk_vec2(*pfVar7,pfVar7[1]);
              fStack_f4 = nVar12.y;
              nVar12 = nk_vec2(fVar10 + local_f0,fVar11 + fStack_f4);
              *pnVar8 = nVar12;
              fVar10 = *in_RSI;
              nVar12 = nk_vec2(*pfVar7,pfVar7[1]);
              local_108 = nVar12.x;
              fVar11 = in_RSI[1];
              nVar12 = nk_vec2(*pfVar7,pfVar7[1]);
              fStack_10c = nVar12.y;
              nVar12 = nk_vec2(fVar10 - local_108,fVar11 - fStack_10c);
              pnVar8[1] = nVar12;
              nVar12 = nk_vec2(pfVar7[(ulong)(in_EDX - 1) * 2],pfVar7[(ulong)(in_EDX - 1) * 2 + 1]);
              local_e0 = nVar12.x;
              fStack_dc = nVar12.y;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] + local_e0,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] + fStack_dc);
              pnVar8[in_EDX * 2 - 2] = nVar12;
              nVar12 = nk_vec2(in_RSI[(ulong)(in_EDX - 1) * 2] - local_e0,
                               in_RSI[(ulong)(in_EDX - 1) * 2 + 1] - fStack_dc);
              pnVar8[in_EDX * 2 - 1] = nVar12;
            }
            iVar3 = iVar5;
            for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
              if (local_60 + 1 == (ulong)in_EDX) {
                local_388 = 0;
              }
              else {
                local_388 = local_60 + 1;
              }
              iVar4 = iVar5;
              if (local_60 + 1 != (ulong)in_EDX) {
                iVar4 = iVar3 + 3;
              }
              nVar12 = nk_vec2(pfVar7[local_60 * 2] + pfVar7[local_388 * 2],
                               pfVar7[local_60 * 2 + 1] + pfVar7[local_388 * 2 + 1]);
              local_158 = nVar12.x;
              nVar12 = nk_vec2(pfVar7[local_60 * 2] + pfVar7[local_388 * 2],
                               pfVar7[local_60 * 2 + 1] + pfVar7[local_388 * 2 + 1]);
              fStack_15c = nVar12.y;
              local_130 = nk_vec2(local_158 * 0.5,fStack_15c * 0.5);
              local_39c = local_130.x * local_130.x + local_130.y * local_130.y;
              if (1e-06 < local_39c) {
                local_39c = 1.0 / local_39c;
                if (100.0 < local_39c) {
                  local_39c = 100.0;
                }
                local_130 = nk_vec2(local_130.x * local_39c,local_130.y * local_39c);
              }
              nVar12 = nk_vec2(local_130.x,local_130.y);
              local_130.x = nVar12.x;
              local_130.y = nVar12.y;
              nVar12 = nk_vec2(in_RSI[local_388 * 2] + local_130.x,
                               in_RSI[local_388 * 2 + 1] + local_130.y);
              pnVar8[local_388 * 2] = nVar12;
              nVar12 = nk_vec2(in_RSI[local_388 * 2] - local_130.x,
                               in_RSI[local_388 * 2 + 1] - local_130.y);
              pnVar8[local_388 * 2 + 1] = nVar12;
              nVar1 = (nk_draw_index)iVar4;
              *local_90 = nVar1;
              nVar2 = (nk_draw_index)iVar3;
              local_90[1] = nVar2;
              local_90[2] = nVar2 + 2;
              local_90[3] = nVar2 + 2;
              local_90[4] = nVar1 + 2;
              local_90[5] = nVar1;
              local_90[6] = nVar1 + 1;
              local_90[7] = nVar2 + 1;
              local_90[8] = nVar2;
              local_90[9] = nVar2;
              local_90[10] = nVar1;
              local_90[0xb] = nVar1 + 1;
              local_90 = local_90 + 0xc;
              iVar3 = iVar4;
            }
            for (local_d8 = 0; local_d8 < in_EDX; local_d8 = local_d8 + 1) {
              color_00._8_8_ = in_stack_fffffffffffffb60;
              color_00.r = (float)(int)in_stack_fffffffffffffb58;
              color_00.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_00);
              color_01._8_8_ = in_stack_fffffffffffffb60;
              color_01.r = (float)(int)in_stack_fffffffffffffb58;
              color_01.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_01);
              color_02._8_8_ = in_stack_fffffffffffffb60;
              color_02.r = (float)(int)in_stack_fffffffffffffb58;
              color_02.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
              nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,color_02);
            }
          }
          nk_buffer_reset(*(nk_buffer **)(in_RDI + 0xb8),NK_BUFFER_FRONT);
        }
      }
    }
    else {
      iVar5 = *(int *)(in_RDI + 0xcc);
      local_2b0 = nk_draw_list_alloc_vertices
                            (in_stack_fffffffffffffb38,(nk_size)in_stack_fffffffffffffb30);
      local_2b8 = nk_draw_list_alloc_elements
                            (in_stack_fffffffffffffb38,(nk_size)in_stack_fffffffffffffb30);
      if ((local_2b0 != (void *)0x0) && (local_2b8 != (nk_draw_index *)0x0)) {
        for (local_290 = 0; fVar10 = (float)((ulong)in_stack_fffffffffffffb30 >> 0x20),
            local_290 < local_30; local_290 = local_290 + 1) {
          if (local_290 + 1 == (ulong)in_EDX) {
            nVar12.x = 0.0;
            nVar12.y = 0.0;
          }
          else {
            nVar12 = (nk_vec2)(local_290 + 1);
          }
          local_2e0 = (float)*(undefined8 *)(in_RSI + (long)nVar12 * 2);
          fStack_2dc = (float)((ulong)*(undefined8 *)(in_RSI + (long)nVar12 * 2) >> 0x20);
          local_2d8 = (float)*(undefined8 *)(in_RSI + local_290 * 2);
          fStack_2d4 = (float)((ulong)*(undefined8 *)(in_RSI + local_290 * 2) >> 0x20);
          nVar13 = nk_vec2(local_2e0 - local_2d8,fStack_2dc - fStack_2d4);
          local_2e8 = nVar13.x;
          fStack_2e4 = nVar13.y;
          fVar11 = local_2e8 * local_2e8 + fStack_2e4 * fStack_2e4;
          if ((fVar11 != 0.0) || (NAN(fVar11))) {
            local_2ec = nk_inv_sqrt(fVar10);
          }
          else {
            local_2ec = 1.0;
          }
          nVar13 = nk_vec2(local_2e8 * local_2ec,fStack_2e4 * local_2ec);
          local_2e8 = nVar13.x;
          local_2e8 = local_2e8 * in_XMM0_Da * 0.5;
          fStack_2e4 = nVar13.y;
          fStack_2e4 = fStack_2e4 * in_XMM0_Da * 0.5;
          nk_vec2(local_2d8 + fStack_2e4,fStack_2d4 - local_2e8);
          color_07._8_8_ = in_stack_fffffffffffffb60;
          color_07.r = (float)(int)in_stack_fffffffffffffb58;
          color_07.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
          nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,nVar12,
                         in_stack_fffffffffffffb68,color_07);
          in_stack_fffffffffffffb48 = (nk_convert_config *)(in_RDI + 0x70);
          nk_vec2(local_2e0 + fStack_2e4,fStack_2dc - local_2e8);
          color_08._8_8_ = in_stack_fffffffffffffb60;
          color_08.r = (float)(int)in_stack_fffffffffffffb58;
          color_08.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
          in_stack_fffffffffffffb50 =
               nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,nVar12,
                              in_stack_fffffffffffffb68,color_08);
          in_stack_fffffffffffffb58 = in_RDI + 0x70;
          nk_vec2(local_2e0 - fStack_2e4,fStack_2dc + local_2e8);
          color_09._8_8_ = in_stack_fffffffffffffb60;
          color_09.r = (float)(int)in_stack_fffffffffffffb58;
          color_09.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
          in_stack_fffffffffffffb60 =
               nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,nVar12,
                              in_stack_fffffffffffffb68,color_09);
          in_stack_fffffffffffffb68 = (nk_vec2)(in_RDI + 0x70);
          nk_vec2(local_2d8 - fStack_2e4,fStack_2d4 + local_2e8);
          color_10._8_8_ = in_stack_fffffffffffffb60;
          color_10.r = (float)(int)in_stack_fffffffffffffb58;
          color_10.g = (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
          pvVar6 = nk_draw_vertex(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,nVar12,
                                  in_stack_fffffffffffffb68,color_10);
          nVar1 = (nk_draw_index)iVar5;
          *local_2b8 = nVar1;
          local_2b8[1] = nVar1 + 1;
          local_2b8[2] = nVar1 + 2;
          local_2b8[3] = nVar1;
          local_2b8[4] = nVar1 + 2;
          local_2b8[5] = nVar1 + 3;
          local_2b8 = local_2b8 + 6;
          iVar5 = iVar5 + 4;
          in_stack_fffffffffffffb30 = local_2b0;
          local_2b0 = pvVar6;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
float thickness, enum nk_anti_aliasing aliasing)
{
nk_size count;
int thick_line;
struct nk_colorf col;
struct nk_colorf col_trans;
NK_ASSERT(list);
if (!list || points_count < 2) return;

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
count = points_count;
if (!closed) count = points_count-1;
thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
/* ANTI-ALIASED STROKE */
const float AA_SIZE = 1.0f;
NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

/* allocate vertices and elements  */
nk_size i1 = 0;
nk_size vertex_offset;
nk_size index = list->vertex_count;

const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size;
struct nk_vec2 *normals, *temp;
if (!vtx || !ids) return;

/* temporary allocate normals + points */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
temp = normals + points_count;

/* make sure vertex pointer is still correct */
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* calculate normals */
for (i1 = 0; i1 < count; ++i1) {
const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;

diff = nk_vec2_muls(diff, len);
normals[i1].x = diff.y;
normals[i1].y = -diff.x;
}

if (!closed)
normals[points_count-1] = normals[points_count-2];

if (!thick_line) {
nk_size idx1, i;
if (!closed) {
struct nk_vec2 d;
temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
}

/* fill elements */
idx1 = index;
for (i1 = 0; i1 < count; i1++) {
struct nk_vec2 dm;
float dmr2;
nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

/* average normals */
dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm = nk_vec2_muls(dm, AA_SIZE);
temp[i2*2+0] = nk_vec2_add(points[i2], dm);
temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
ids += 12;
idx1 = idx2;
}

/* fill vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
}
} else {
nk_size idx1, i;
const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
if (!closed) {
struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

temp[0] = nk_vec2_add(points[0], d1);
temp[1] = nk_vec2_add(points[0], d2);
temp[2] = nk_vec2_sub(points[0], d2);
temp[3] = nk_vec2_sub(points[0], d1);

d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
}

/* add all elements */
idx1 = index;
for (i1 = 0; i1 < count; ++i1) {
struct nk_vec2 dm_out, dm_in;
const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

/* average normals */
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
float dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
dm_in = nk_vec2_muls(dm, half_inner_thickness);
temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

/* add indexes */
ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
ids += 18;
idx1 = idx2;
}

/* add vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
}
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
/* NON ANTI-ALIASED STROKE */
nk_size i1 = 0;
nk_size idx = list->vertex_count;
const nk_size idx_count = count * 6;
const nk_size vtx_count = count * 4;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
if (!vtx || !ids) return;

for (i1 = 0; i1 < count; ++i1) {
float dx, dy;
const struct nk_vec2 uv = list->config.null.uv;
const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
const struct nk_vec2 p1 = points[i1];
const struct nk_vec2 p2 = points[i2];
struct nk_vec2 diff = nk_vec2_sub(p2, p1);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

/* add vertices */
dx = diff.x * (thickness * 0.5f);
dy = diff.y * (thickness * 0.5f);

vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

ids += 6;
idx += 4;
}
}
}